

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LJ.cpp
# Opt level: O2

void __thiscall OpenMD::LJ::getLJfunc(LJ *this,RealType r,RealType *pot,RealType *deriv)

{
  double dVar1;
  double dVar2;
  double dVar3;
  
  dVar2 = 1.0 / r;
  dVar1 = dVar2 * dVar2;
  dVar1 = dVar1 * dVar1 * dVar1;
  dVar3 = dVar2 * dVar1 * dVar1;
  *pot = (dVar1 * dVar1 - dVar1) * 4.0;
  *deriv = (dVar2 * dVar1 - (dVar3 + dVar3)) * 24.0;
  return;
}

Assistant:

void LJ::getLJfunc(RealType r, RealType& pot, RealType& deriv) {
    RealType ri   = 1.0 / r;
    RealType ri2  = ri * ri;
    RealType ri6  = ri2 * ri2 * ri2;
    RealType ri7  = ri6 * ri;
    RealType ri12 = ri6 * ri6;
    RealType ri13 = ri12 * ri;

    pot   = 4.0 * (ri12 - ri6);
    deriv = 24.0 * (ri7 - 2.0 * ri13);

    return;
  }